

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_cover<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  byte bVar1;
  uint uVar2;
  v_array<ACTION_SCORE::action_score> *this;
  byte bVar3;
  reference ppeVar4;
  size_t sVar5;
  float *pfVar6;
  action_score *paVar7;
  wclass *pwVar8;
  reference pvVar9;
  action_score *paVar10;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  ulong uVar11;
  v_array<ACTION_SCORE::action_score> *in_RDI;
  float fVar12;
  float fVar13;
  __type _Var14;
  label *in_stack_00000040;
  multi_ex *in_stack_00000048;
  cb_to_cs_adf *in_stack_00000050;
  size_t i_6;
  cb_explore_adf *in_stack_000000e0;
  uint32_t action;
  size_t i_5;
  float add_prob;
  size_t tied_actions_1;
  uint32_t i_4;
  float pseudo_cost;
  uint32_t j;
  size_t i_3;
  float norm;
  size_t i_2;
  size_t tied_actions;
  uint32_t i_1;
  uint32_t i;
  v_array<ACTION_SCORE::action_score> *probs;
  float min_prob;
  float additive_probability;
  uint32_t num_actions;
  v_array<ACTION_SCORE::action_score> *preds;
  bool is_mtr;
  wclass *in_stack_fffffffffffffe68;
  v_array<COST_SENSITIVE::wclass> *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined4 in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  float in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeb0;
  undefined1 update_zero_elements;
  float in_stack_fffffffffffffeb4;
  uint32_t in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  float in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff10;
  uint uVar15;
  float local_e4;
  ulong local_e0;
  ulong local_b0;
  uint local_94;
  uint local_7c;
  action_score *local_78;
  ulong local_68;
  uint local_58;
  uint local_4c;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  uint local_2c;
  v_array<ACTION_SCORE::action_score> *local_28;
  undefined1 local_19;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  v_array<ACTION_SCORE::action_score> *local_8;
  
  local_19 = in_RDI[6]._begin == (action_score *)0x3;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if ((bool)local_19) {
    GEN_CS::gen_cs_example_dr<true>
              ((cb_to_cs_adf *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (multi_ex *)in_stack_fffffffffffffea8,
               (label *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  }
  else {
    GEN_CS::gen_cs_example<false>(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  }
  uVar15 = 0;
  LEARNER::multiline_learn_or_predict<true>
            ((multi_learner *)in_stack_fffffffffffffee0,
             (multi_ex *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffecc
            );
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,(ulong)uVar15);
  local_28 = (v_array<ACTION_SCORE::action_score> *)&(*ppeVar4)->pred;
  sVar5 = v_array<ACTION_SCORE::action_score>::size(local_28);
  local_2c = (uint)sVar5;
  local_e4 = (float)local_8[3].end_array;
  local_30 = 1.0 / local_e4;
  local_38 = 1.0 / (float)(sVar5 & 0xffffffff);
  _Var14 = std::sqrt<unsigned_long>(0x35dde4);
  local_3c = 1.0 / (float)_Var14;
  pfVar6 = std::min<float>(&local_38,&local_3c);
  this = local_8;
  local_34 = *pfVar6;
  v_array<ACTION_SCORE::action_score>::clear
            ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffe70);
  for (local_4c = 0; local_4c < local_2c; local_4c = local_4c + 1) {
    v_array<ACTION_SCORE::action_score>::push_back
              ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffe70,
               (action_score *)in_stack_fffffffffffffe68);
  }
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x35deaa);
  for (local_58 = 0; local_58 < local_2c; local_58 = local_58 + 1) {
    v_array<ACTION_SCORE::action_score>::operator[](local_28,(ulong)local_58);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (value_type_conflict3 *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)
              );
  }
  if (((ulong)local_8[4].end_array & 0x100) == 0) {
    sVar5 = fill_tied((cb_explore_adf *)
                      CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                      (v_array<ACTION_SCORE::action_score> *)
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    for (local_68 = 0; local_68 < sVar5; local_68 = local_68 + 1) {
      in_stack_ffffffffffffff00 = (float)(long)sVar5;
      in_stack_ffffffffffffff04 = (float)sVar5;
      in_stack_fffffffffffffef8 = local_30 / in_stack_ffffffffffffff04;
      in_stack_fffffffffffffef0 = this;
      in_stack_fffffffffffffefc = local_30;
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_68);
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                         (in_stack_fffffffffffffef0,(ulong)paVar7->action);
      paVar7->score = in_stack_fffffffffffffef8 + paVar7->score;
    }
  }
  else {
    in_stack_fffffffffffffee0 = this;
    in_stack_fffffffffffffeec = local_30;
    paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,0);
    paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                       (in_stack_fffffffffffffee0,(ulong)paVar7->action);
    paVar7->score = in_stack_fffffffffffffeec + paVar7->score;
  }
  for (local_78 = (action_score *)0x1;
      update_zero_elements = (undefined1)((uint)in_stack_fffffffffffffeb0 >> 0x18),
      local_78 < local_8[3].end_array; local_78 = (action_score *)((long)&local_78->action + 1)) {
    v_array<COST_SENSITIVE::wclass>::clear(in_stack_fffffffffffffe70);
    for (local_7c = 0; local_7c < local_2c; local_7c = local_7c + 1) {
      pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)&local_8[9].end_array,(ulong)local_7c);
      in_stack_fffffffffffffedc = pwVar8->x;
      in_stack_fffffffffffffed8 = *(float *)&local_8[3].erase_count * local_34;
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)local_7c);
      std::max<float>(&paVar7->score,&local_34);
      v_array<COST_SENSITIVE::wclass>::push_back
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    in_stack_fffffffffffffe68 = (wclass *)((long)&local_78->action + 1);
    GEN_CS::call_cs_ldf<true>
              ((multi_learner *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (multi_ex *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (v_array<CB::label> *)in_stack_fffffffffffffef0,
               (label *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (v_array<COST_SENSITIVE::label> *)in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               CONCAT44(uVar15,in_stack_ffffffffffffff10));
    for (local_94 = 0; local_94 < local_2c; local_94 = local_94 + 1) {
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,(ulong)local_94);
      fVar12 = paVar7->score;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_8 + 1),(ulong)local_94);
      *pvVar9 = fVar12 + *pvVar9;
    }
    if (((ulong)local_8[4].end_array & 0x100) == 0) {
      sVar5 = fill_tied((cb_explore_adf *)
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                        (v_array<ACTION_SCORE::action_score> *)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      fVar12 = local_30 / (float)sVar5;
      for (local_b0 = 0; local_b0 < sVar5; local_b0 = local_b0 + 1) {
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_b0);
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)paVar7->action);
        if (paVar7->score < local_34) {
          in_stack_fffffffffffffea8 = this;
          in_stack_fffffffffffffeb0 = local_34;
          in_stack_fffffffffffffeb4 = fVar12;
          paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_b0);
          paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                             (in_stack_fffffffffffffea8,(ulong)paVar7->action);
          fVar13 = in_stack_fffffffffffffeb4 - (in_stack_fffffffffffffeb0 - paVar7->score);
          uVar11 = (ulong)fVar13;
          max(0,uVar11 | (long)(fVar13 - 9.223372e+18) & (long)uVar11 >> 0x3f);
        }
        in_stack_fffffffffffffea4 = fVar12;
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_b0);
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)paVar7->action);
        paVar7->score = in_stack_fffffffffffffea4 + paVar7->score;
      }
    }
    else {
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,0);
      uVar2 = paVar7->action;
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)uVar2);
      if (paVar7->score < local_34) {
        in_stack_fffffffffffffe88 = local_34;
        in_stack_fffffffffffffe8c = local_30;
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)uVar2);
        fVar12 = in_stack_fffffffffffffe8c - (in_stack_fffffffffffffe88 - paVar7->score);
        uVar11 = (ulong)fVar12;
        max(0,uVar11 | (long)(fVar12 - 9.223372e+18) & (long)uVar11 >> 0x3f);
      }
      in_stack_fffffffffffffe84 = local_30;
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)uVar2);
      paVar7->score = in_stack_fffffffffffffe84 + paVar7->score;
    }
  }
  bVar1 = *(byte *)((long)&local_8[3].erase_count + 4);
  bVar3 = bVar1 ^ 0xff;
  ACTION_SCORE::begin_scores
            ((action_scores *)(CONCAT17(bVar1,in_stack_fffffffffffffe78) ^ 0xff00000000000000));
  ACTION_SCORE::end_scores((action_scores *)CONCAT17(bVar3,in_stack_fffffffffffffe78));
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (in_stack_fffffffffffffeb4,(bool)update_zero_elements,
             (score_iterator *)in_stack_fffffffffffffea8,
             (score_iterator *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  do_sort(in_stack_000000e0);
  for (local_e0 = 0; local_e0 < local_2c; local_e0 = local_e0 + 1) {
    paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,local_e0);
    paVar10 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_e0);
    *paVar10 = *paVar7;
  }
  local_8[5]._begin = (action_score *)((long)&(local_8[5]._begin)->action + 1);
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost = data.cs_labels.costs[j].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}